

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollectorOutput.cpp
# Opt level: O2

void __thiscall Test::CollectorOutput::printSuccess(CollectorOutput *this,Assertion *assertion)

{
  runtime_error *this_00;
  
  if (this->currentMethod != (TestMethodInfo *)0x0) {
    std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>::push_back
              (&this->currentMethod->passedAssertions,assertion);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid Test-Method!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CollectorOutput::printSuccess(const Assertion &assertion) {
  if (currentMethod == nullptr)
    throw std::runtime_error("Invalid Test-Method!");
  currentMethod->passedAssertions.push_back(assertion);
}